

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O3

void av1_write_obu_tg_tile_headers
               (AV1_COMP *cpi,MACROBLOCKD *xd,PackBSParams *pack_bs_params,int tile_idx)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  byte *pbVar5;
  uint32_t uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  aom_write_bit_buffer local_40;
  
  iVar10 = (cpi->common).tiles.cols;
  iVar3 = (cpi->common).tiles.rows;
  iVar4 = cpi->num_tg;
  bVar1 = ((cpi->common).seq_params)->has_nonzero_operating_point_idc;
  bVar2 = pack_bs_params->obu_extn_header;
  pbVar5 = pack_bs_params->tile_data_curr;
  if ((iVar4 == 1) && ((cpi->ppi->level_params).keep_level_stats != 0)) {
    cpi->frame_header_count = cpi->frame_header_count + 1;
  }
  *pbVar5 = (iVar4 == 1) << 4 | bVar1 * '\x04' | 0x22;
  uVar7 = 1;
  if (bVar1 != false) {
    pbVar5[1] = bVar2;
    uVar7 = 2;
  }
  pack_bs_params->curr_tg_hdr_size = uVar7;
  pack_bs_params->obu_header_size = uVar7;
  iVar9 = cpi->num_tg;
  if (iVar9 == 1) {
    uVar6 = write_frame_header_obu
                      (cpi,xd,pack_bs_params->saved_wb,pack_bs_params->tile_data_curr + uVar7,0);
    uVar7 = uVar6 + pack_bs_params->curr_tg_hdr_size;
    pack_bs_params->curr_tg_hdr_size = uVar7;
    iVar9 = cpi->num_tg;
  }
  iVar8 = (cpi->common).tiles.rows * (cpi->common).tiles.cols;
  iVar10 = (iVar10 * iVar3 + iVar4 + -1) / iVar4 + tile_idx;
  if (iVar10 < iVar8) {
    iVar8 = iVar10;
  }
  local_40.bit_buffer = pack_bs_params->tile_data_curr + (int)uVar7;
  iVar10 = (cpi->common).tiles.log2_cols + (cpi->common).tiles.log2_rows;
  local_40.bit_offset = 0;
  if (iVar10 == 0) {
    uVar6 = 0;
  }
  else {
    aom_wb_write_bit(&local_40,(uint)(1 < iVar9));
    if (1 < iVar9) {
      aom_wb_write_literal(&local_40,tile_idx,iVar10);
      aom_wb_write_literal(&local_40,iVar8 + -1,iVar10);
    }
    uVar6 = aom_wb_bytes_written(&local_40);
    uVar7 = pack_bs_params->curr_tg_hdr_size;
  }
  pack_bs_params->curr_tg_hdr_size = uVar7 + uVar6;
  *pack_bs_params->total_size = *pack_bs_params->total_size + uVar7 + uVar6;
  return;
}

Assistant:

void av1_write_obu_tg_tile_headers(AV1_COMP *const cpi, MACROBLOCKD *const xd,
                                   PackBSParams *const pack_bs_params,
                                   const int tile_idx) {
  AV1_COMMON *const cm = &cpi->common;
  const CommonTileParams *const tiles = &cm->tiles;
  int *const curr_tg_hdr_size = &pack_bs_params->curr_tg_hdr_size;
  const int tg_size =
      (tiles->rows * tiles->cols + cpi->num_tg - 1) / cpi->num_tg;

  // Write Tile group, frame and OBU header
  // A new tile group begins at this tile.  Write the obu header and
  // tile group header
  const OBU_TYPE obu_type = (cpi->num_tg == 1) ? OBU_FRAME : OBU_TILE_GROUP;
  *curr_tg_hdr_size = av1_write_obu_header(
      &cpi->ppi->level_params, &cpi->frame_header_count, obu_type,
      cm->seq_params->has_nonzero_operating_point_idc,
      /*is_layer_specific_obu=*/true, pack_bs_params->obu_extn_header,
      pack_bs_params->tile_data_curr);
  pack_bs_params->obu_header_size = *curr_tg_hdr_size;

  if (cpi->num_tg == 1)
    *curr_tg_hdr_size += write_frame_header_obu(
        cpi, xd, pack_bs_params->saved_wb,
        pack_bs_params->tile_data_curr + *curr_tg_hdr_size, 0);
  *curr_tg_hdr_size += write_tile_group_header(
      pack_bs_params->tile_data_curr + *curr_tg_hdr_size, tile_idx,
      AOMMIN(tile_idx + tg_size - 1, tiles->cols * tiles->rows - 1),
      (tiles->log2_rows + tiles->log2_cols), cpi->num_tg > 1);
  *pack_bs_params->total_size += *curr_tg_hdr_size;
}